

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::MaxUniformLocationCase::iterate
          (MaxUniformLocationCase *this)

{
  int iVar1;
  IterateResult IVar2;
  undefined4 extraout_var;
  reference pvVar3;
  undefined1 local_30 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  uniformInfo;
  int maxLocation;
  MaxUniformLocationCase *this_local;
  
  uniformInfo.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x400;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
            *)local_30,&(this->super_UniformLocationCase).m_uniformInfo);
  iVar1 = (*((this->super_UniformLocationCase).m_renderCtx)->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))
            (0x826e,(undefined1 *)
                    ((long)&uniformInfo.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  iVar1 = uniformInfo.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1;
  pvVar3 = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
           ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                         *)local_30,0);
  pvVar3->location = iVar1;
  IVar2 = UniformLocationCase::run
                    (&this->super_UniformLocationCase,
                     (vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                      *)local_30);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
             *)local_30);
  return IVar2;
}

Assistant:

UniformLocationCase::IterateResult MaxUniformLocationCase::iterate (void)
{
	int					maxLocation = 1024;
	vector<UniformInfo>	uniformInfo = m_uniformInfo;

	m_renderCtx.getFunctions().getIntegerv(GL_MAX_UNIFORM_LOCATIONS, &maxLocation);

	uniformInfo[0].location = maxLocation-1;

	return UniformLocationCase::run(uniformInfo);
}